

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_69(QPDF *pdf,char *arg2)

{
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong __n;
  QPDFObjectHandle QVar2;
  allocator<char> local_e1;
  QPDF out;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  undefined1 local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [3];
  string outname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  QPDF::setImmediateCopyFrom(SUB81(pdf,0));
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&pages,__x);
  for (__n = 0; __n < (ulong)((long)pages.
                                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)pages.
                                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    QPDF::QPDF(&out);
    QPDF::emptyPDF();
    p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&pages,__n);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_c0,p_Var1);
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0;
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&out;
    QPDF::addPage(QVar2,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"auto-",&local_e1);
    QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_50,(int)__n);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,&local_b0
                   ,&local_50);
    std::operator+(&outname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                   ".pdf");
    std::__cxx11::string::~string((string *)&w);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    QPDFWriter::QPDFWriter(&w,&out,outname._M_dataplus._M_p);
    QPDFWriter::setStaticID
              (SUB81((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
    std::__cxx11::string::~string((string *)&outname);
    QPDF::~QPDF(&out);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&pages);
  return;
}

Assistant:

static void
test_69(QPDF& pdf, char const* arg2)
{
    pdf.setImmediateCopyFrom(true);
    auto pages = pdf.getAllPages();
    for (size_t i = 0; i < pages.size(); ++i) {
        QPDF out;
        out.emptyPDF();
        out.addPage(pages.at(i), false);
        std::string outname = std::string("auto-") + QUtil::uint_to_string(i) + ".pdf";
        QPDFWriter w(out, outname.c_str());
        w.setStaticID(true);
        w.write();
    }
}